

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void MirrorRow_C(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  long lVar2;
  uint8_t *puVar3;
  long lVar4;
  
  lVar1 = (long)(width + -1);
  puVar3 = src + lVar1;
  if (1 < width) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      dst[lVar4] = puVar3[lVar2];
      dst[lVar4 + 1] = puVar3[lVar2 + -1];
      lVar4 = lVar4 + 2;
      lVar2 = lVar2 + -2;
    } while (lVar4 < lVar1);
    puVar3 = puVar3 + -lVar4;
  }
  if ((width & 1U) != 0) {
    dst[lVar1] = *puVar3;
  }
  return;
}

Assistant:

void MirrorRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int x;
  src += width - 1;
  for (x = 0; x < width - 1; x += 2) {
    dst[x] = src[0];
    dst[x + 1] = src[-1];
    src -= 2;
  }
  if (width & 1) {
    dst[width - 1] = src[0];
  }
}